

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void lowerFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  uchar *z;
  int n;
  int i;
  char *z2;
  char *z1;
  _func_void_void_ptr *in_stack_ffffffffffffffc8;
  int n_00;
  sqlite3_context *psVar2;
  
  psVar2 = (sqlite3_context *)&DAT_aaaaaaaaaaaaaaaa;
  z = sqlite3_value_text((sqlite3_value *)0x224451);
  iVar1 = sqlite3_value_bytes((sqlite3_value *)0x224463);
  if ((z != (uchar *)0x0) &&
     (psVar2 = (sqlite3_context *)contextMalloc(psVar2,(i64)z), psVar2 != (sqlite3_context *)0x0)) {
    for (n_00 = 0; n_00 < iVar1; n_00 = n_00 + 1) {
      *(uchar *)((long)psVar2->argv + (long)n_00 + -0x30) = ""[z[n_00]];
    }
    sqlite3_result_text(psVar2,(char *)z,n_00,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

static void lowerFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  char *z1;
  const char *z2;
  int i, n;
  UNUSED_PARAMETER(argc);
  z2 = (char*)sqlite3_value_text(argv[0]);
  n = sqlite3_value_bytes(argv[0]);
  /* Verify that the call to _bytes() does not invalidate the _text() pointer */
  assert( z2==(char*)sqlite3_value_text(argv[0]) );
  if( z2 ){
    z1 = contextMalloc(context, ((i64)n)+1);
    if( z1 ){
      for(i=0; i<n; i++){
        z1[i] = sqlite3Tolower(z2[i]);
      }
      sqlite3_result_text(context, z1, n, sqlite3_free);
    }
  }
}